

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.cc
# Opt level: O1

void addStandardTypes(Registry *r)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  int iVar3;
  void *pvVar4;
  Registry *pRVar5;
  Type *this;
  long *plVar6;
  Numeric *pNVar7;
  type tVar8;
  long *plVar9;
  size_type *psVar10;
  ulong *puVar11;
  char *tmp_finish;
  long lVar12;
  string normalized_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char *local_b8;
  ulong *local_b0;
  char *local_a8;
  ulong local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> local_70;
  Registry *local_50;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> local_48;
  
  this = (Type *)operator_new(0x40);
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/nil","");
  Typelib::Type::Type(this,(string *)&local_d8,0,NullType);
  *(undefined ***)this = &PTR__Type_0010ecb8;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  Typelib::Registry::add((Type *)r,(string *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/nil","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/void","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)r,(string *)&local_d8,(string *)&local_90);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_50 = r;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  lVar12 = 0;
  do {
    iVar3 = *(int *)((long)addStandardTypes::sizes + lVar12);
    local_b0 = &local_a0;
    local_a8 = (char *)0x0;
    local_a0 = local_a0 & 0xffffffffffffff00;
    local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
    pcVar2 = (char *)((long)&local_d8.field_2 + 7);
    tVar8 = iVar3 * -8;
    if (iVar3 * -8 < 0) {
      tVar8 = iVar3 * 8;
    }
    local_70.m_value = tVar8;
    local_70.m_czero = '0';
    local_70.m_zero = 0x30;
    local_b8 = pcVar2;
    local_70.m_finish = pcVar2;
    local_d8.field_2._8_8_ =
         boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                   (&local_70);
    local_b8 = pcVar2;
    std::__cxx11::string::replace((ulong)&local_b0,0,local_a8,local_d8.field_2._8_8_);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x10b46a);
    local_f8 = &local_e8;
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_e8 = *plVar9;
      lStack_e0 = plVar6[3];
    }
    else {
      local_e8 = *plVar9;
      local_f8 = (long *)*plVar6;
    }
    local_f0 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_90.field_2._M_allocated_capacity = *psVar10;
      local_90.field_2._8_8_ = plVar6[3];
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar10;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    pNVar7 = (Numeric *)operator_new(0x48);
    std::operator+(&local_d8,"/",&local_90);
    Typelib::Numeric::Numeric(pNVar7,(string *)&local_d8,(long)iVar3,SInt);
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    Typelib::Registry::add((Type *)local_50,(string *)pNVar7);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    pNVar7 = (Numeric *)operator_new(0x48);
    std::operator+(&local_d8,"/u",&local_90);
    Typelib::Numeric::Numeric(pNVar7,(string *)&local_d8,(long)iVar3,UInt);
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    Typelib::Registry::add((Type *)local_50,(string *)pNVar7);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x10);
  local_a8 = (char *)0x0;
  local_a0 = local_a0 & 0xffffffffffffff00;
  local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
  pcVar2 = (char *)((long)&local_d8.field_2 + 7);
  local_70.m_value = 8;
  local_70.m_czero = '0';
  local_70.m_zero = 0x30;
  local_b8 = pcVar2;
  local_b0 = &local_a0;
  local_70.m_finish = pcVar2;
  local_d8.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 (&local_70);
  local_b8 = pcVar2;
  std::__cxx11::string::replace((ulong)&local_b0,0,local_a8,local_d8.field_2._8_8_);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x10b1b0);
  pRVar5 = local_50;
  paVar1 = &local_d8.field_2;
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_90.field_2._M_allocated_capacity = *psVar10;
    local_90.field_2._8_8_ = plVar6[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar10;
    local_90._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_90._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed char","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/char","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  pvVar4 = (void *)((long)&local_70 + 0x10);
  local_70.m_finish = (char *)0x0;
  local_70.m_czero = '\0';
  local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
  local_48.m_value = 8;
  local_48.m_czero = '0';
  local_48.m_zero = 0x30;
  local_b8 = pcVar2;
  local_70._0_8_ = pvVar4;
  local_48.m_finish = pcVar2;
  local_d8.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 (&local_48);
  local_b8 = pcVar2;
  std::__cxx11::string::replace((ulong)&local_70,0,local_70.m_finish,local_d8.field_2._8_8_);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10b1c8);
  local_b0 = &local_a0;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar6;
  }
  local_a8 = (char *)plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  pcVar2 = (char *)((long)&local_d8.field_2 + 7);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((void *)local_70._0_8_ != pvVar4) {
    operator_delete((void *)local_70._0_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/unsigned char","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_70.m_finish = (char *)0x0;
  local_70.m_czero = '\0';
  local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
  local_48.m_value = 0x20;
  local_48.m_czero = '0';
  local_48.m_zero = 0x30;
  local_b8 = pcVar2;
  local_70._0_8_ = pvVar4;
  local_48.m_finish = pcVar2;
  local_d8.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 (&local_48);
  local_b8 = pcVar2;
  std::__cxx11::string::replace((ulong)&local_70,0,local_70.m_finish,local_d8.field_2._8_8_);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10b1b0);
  local_b0 = &local_a0;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar6;
  }
  local_a8 = (char *)plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  pcVar2 = (char *)((long)&local_d8.field_2 + 7);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((void *)local_70._0_8_ != pvVar4) {
    operator_delete((void *)local_70._0_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/wchar_t","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_70.m_finish = (char *)0x0;
  local_70.m_czero = '\0';
  local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
  local_48.m_value = 0x10;
  local_48.m_czero = '0';
  local_48.m_zero = 0x30;
  local_b8 = pcVar2;
  local_70._0_8_ = pvVar4;
  local_48.m_finish = pcVar2;
  local_d8.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 (&local_48);
  local_b8 = pcVar2;
  std::__cxx11::string::replace((ulong)&local_70,0,local_70.m_finish,local_d8.field_2._8_8_);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10b1b0);
  local_b0 = &local_a0;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar6;
  }
  local_a8 = (char *)plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  pcVar2 = (char *)((long)&local_d8.field_2 + 7);
  if ((void *)local_70._0_8_ != pvVar4) {
    operator_delete((void *)local_70._0_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed short int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed int short","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/int signed short","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/short signed int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed short int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed short","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/short signed","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/short","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/short int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_70.m_finish = (char *)0x0;
  local_70.m_czero = '\0';
  local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
  local_48.m_value = 0x10;
  local_48.m_czero = '0';
  local_48.m_zero = 0x30;
  local_b8 = pcVar2;
  local_70._0_8_ = pvVar4;
  local_48.m_finish = pcVar2;
  local_d8.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 (&local_48);
  local_b8 = pcVar2;
  std::__cxx11::string::replace((ulong)&local_70,0,local_70.m_finish,local_d8.field_2._8_8_);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10b1c8);
  local_b0 = &local_a0;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar6;
  }
  local_a8 = (char *)plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  pcVar2 = (char *)((long)&local_d8.field_2 + 7);
  if ((void *)local_70._0_8_ != pvVar4) {
    operator_delete((void *)local_70._0_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/short unsigned int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/short int unsigned","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/int short unsigned","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/unsigned short int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/short unsigned","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/unsigned short","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_70.m_finish = (char *)0x0;
  local_70.m_czero = '\0';
  local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
  local_48.m_value = 0x20;
  local_48.m_czero = '0';
  local_48.m_zero = 0x30;
  local_b8 = pcVar2;
  local_70._0_8_ = pvVar4;
  local_48.m_finish = pcVar2;
  local_d8.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 (&local_48);
  local_b8 = pcVar2;
  std::__cxx11::string::replace((ulong)&local_70,0,local_70.m_finish,local_d8.field_2._8_8_);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10b1b0);
  local_b0 = &local_a0;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar6;
  }
  local_a8 = (char *)plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  pcVar2 = (char *)((long)&local_d8.field_2 + 7);
  if ((void *)local_70._0_8_ != pvVar4) {
    operator_delete((void *)local_70._0_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/int signed","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_70.m_finish = (char *)0x0;
  local_70.m_czero = '\0';
  local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
  local_48.m_value = 0x20;
  local_48.m_czero = '0';
  local_48.m_zero = 0x30;
  local_b8 = pcVar2;
  local_70._0_8_ = pvVar4;
  local_48.m_finish = pcVar2;
  local_d8.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 (&local_48);
  local_b8 = pcVar2;
  std::__cxx11::string::replace((ulong)&local_70,0,local_70.m_finish,local_d8.field_2._8_8_);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10b1c8);
  local_b0 = &local_a0;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar6;
  }
  local_a8 = (char *)plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  pcVar2 = (char *)((long)&local_d8.field_2 + 7);
  if ((void *)local_70._0_8_ != pvVar4) {
    operator_delete((void *)local_70._0_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/unsigned int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/unsigned","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/int unsigned","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_70.m_finish = (char *)0x0;
  local_70.m_czero = '\0';
  local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
  local_48.m_value = 0x40;
  local_48.m_czero = '0';
  local_48.m_zero = 0x30;
  local_b8 = pcVar2;
  local_70._0_8_ = pvVar4;
  local_48.m_finish = pcVar2;
  local_d8.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 (&local_48);
  local_b8 = pcVar2;
  std::__cxx11::string::replace((ulong)&local_70,0,local_70.m_finish,local_d8.field_2._8_8_);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10b1b0);
  local_b0 = &local_a0;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar6;
  }
  local_a8 = (char *)plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  pcVar2 = (char *)((long)&local_d8.field_2 + 7);
  if ((void *)local_70._0_8_ != pvVar4) {
    operator_delete((void *)local_70._0_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed long int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed int long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/int signed long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long signed int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed long int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long signed","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_70.m_finish = (char *)0x0;
  local_70.m_czero = '\0';
  local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
  local_48.m_value = 0x40;
  local_48.m_czero = '0';
  local_48.m_zero = 0x30;
  local_b8 = pcVar2;
  local_70._0_8_ = pvVar4;
  local_48.m_finish = pcVar2;
  local_d8.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 (&local_48);
  local_b8 = pcVar2;
  std::__cxx11::string::replace((ulong)&local_70,0,local_70.m_finish,local_d8.field_2._8_8_);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10b1c8);
  local_b0 = &local_a0;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar6;
  }
  local_a8 = (char *)plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  pcVar2 = (char *)((long)&local_d8.field_2 + 7);
  if ((void *)local_70._0_8_ != pvVar4) {
    operator_delete((void *)local_70._0_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long unsigned int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long int unsigned","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/int long unsigned","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/unsigned long int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long unsigned","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/unsigned long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_70.m_finish = (char *)0x0;
  local_70.m_czero = '\0';
  local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
  local_48.m_value = 0x40;
  local_48.m_czero = '0';
  local_48.m_zero = 0x30;
  local_b8 = pcVar2;
  local_70._0_8_ = pvVar4;
  local_48.m_finish = pcVar2;
  local_d8.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 (&local_48);
  local_b8 = pcVar2;
  std::__cxx11::string::replace((ulong)&local_70,0,local_70.m_finish,local_d8.field_2._8_8_);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10b1b0);
  local_b0 = &local_a0;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar6;
  }
  local_a8 = (char *)plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  pcVar2 = (char *)((long)&local_d8.field_2 + 7);
  if ((void *)local_70._0_8_ != pvVar4) {
    operator_delete((void *)local_70._0_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed long long int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed long int long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed int long long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/int signed long long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long signed long int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long long signed int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long long int signed","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/signed long long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long long signed","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long signed long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long long int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long int long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/int long long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_70.m_finish = (char *)0x0;
  local_70.m_czero = '\0';
  local_d8.field_2._8_8_ = (long)&local_d8._M_dataplus._M_p + 2;
  local_48.m_value = 0x40;
  local_48.m_czero = '0';
  local_48.m_zero = 0x30;
  local_b8 = pcVar2;
  local_70._0_8_ = pvVar4;
  local_48.m_finish = pcVar2;
  local_d8.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 (&local_48);
  local_b8 = pcVar2;
  std::__cxx11::string::replace((ulong)&local_70,0,local_70.m_finish,local_d8.field_2._8_8_);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10b1c8);
  local_b0 = &local_a0;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar6;
  }
  local_a8 = (char *)plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_e8 = *plVar9;
    lStack_e0 = plVar6[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar9;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((void *)local_70._0_8_ != pvVar4) {
    operator_delete((void *)local_70._0_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/unsigned long long int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/unsigned long int long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/unsigned int long long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/int unsigned long long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long unsigned long int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long long unsigned int","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long long int unsigned","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/unsigned long long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long long unsigned","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/long unsigned long","");
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::alias((string *)pRVar5,(string *)&local_90,(string *)&local_d8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  pNVar7 = (Numeric *)operator_new(0x48);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/float","");
  Typelib::Numeric::Numeric(pNVar7,(string *)&local_d8,4,Float);
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::add((Type *)pRVar5,(string *)pNVar7);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  pNVar7 = (Numeric *)operator_new(0x48);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/double","");
  Typelib::Numeric::Numeric(pNVar7,(string *)&local_d8,8,Float);
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::add((Type *)pRVar5,(string *)pNVar7);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  pNVar7 = (Numeric *)operator_new(0x48);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/bool","");
  Typelib::Numeric::Numeric(pNVar7,(string *)&local_d8,1,UInt);
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Typelib::Registry::add((Type *)pRVar5,(string *)pNVar7);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void addStandardTypes(Typelib::Registry& r)
{
    BOOST_STATIC_ASSERT((Typelib::NamespaceMark == '/'));

    r.add(new NullType("/nil"));
    r.alias("/nil", "/void");

    // Add standard sized integers
    static const int sizes[] = { 1, 2, 4, 8 };
    for (size_t i = 0; i < sizeof(sizes)/sizeof(sizes[0]); ++i)
    {
        std::string suffix = "int" + boost::lexical_cast<std::string>(sizes[i] * 8) + "_t";
        r.add(new Numeric("/"  + suffix, sizes[i], Numeric::SInt));
        r.add(new Numeric("/u" + suffix, sizes[i], Numeric::UInt));
    }

    std::string normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<signed char>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed char");
    if (std::numeric_limits<char>::is_signed)
        r.alias(normalized_type_name, "/char");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<signed char>::digits + 1) + "_t";
    if (!std::numeric_limits<char>::is_signed)
        r.alias(normalized_type_name, "/char");
    r.alias(normalized_type_name, "/unsigned char");

    if(std::numeric_limits<wchar_t>::is_signed)
    {
        normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<wchar_t>::digits + 1) + "_t";
    } else {
        normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<wchar_t>::digits) + "_t";
    }
    r.alias(normalized_type_name, "/wchar_t");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<short int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed short int");
    r.alias(normalized_type_name, "/signed int short");
    r.alias(normalized_type_name, "/int signed short");
    r.alias(normalized_type_name, "/short signed int");
    r.alias(normalized_type_name, "/signed short int");
    r.alias(normalized_type_name, "/signed short");
    r.alias(normalized_type_name, "/short signed");
    r.alias(normalized_type_name, "/short");
    r.alias(normalized_type_name, "/short int");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<short int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/short unsigned int");
    r.alias(normalized_type_name, "/short int unsigned");
    r.alias(normalized_type_name, "/int short unsigned");
    r.alias(normalized_type_name, "/unsigned short int");
    r.alias(normalized_type_name, "/short unsigned");
    r.alias(normalized_type_name, "/unsigned short");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed int");
    r.alias(normalized_type_name, "/signed");
    r.alias(normalized_type_name, "/int signed");
    r.alias(normalized_type_name, "/int");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<int>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/unsigned int");
    r.alias(normalized_type_name, "/unsigned");
    r.alias(normalized_type_name, "/int unsigned");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed long int");
    r.alias(normalized_type_name, "/signed int long");
    r.alias(normalized_type_name, "/int signed long");
    r.alias(normalized_type_name, "/long signed int");
    r.alias(normalized_type_name, "/signed long int");
    r.alias(normalized_type_name, "/signed long");
    r.alias(normalized_type_name, "/long signed");
    r.alias(normalized_type_name, "/long");
    r.alias(normalized_type_name, "/long int");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/long unsigned int");
    r.alias(normalized_type_name, "/long int unsigned");
    r.alias(normalized_type_name, "/int long unsigned");
    r.alias(normalized_type_name, "/unsigned long int");
    r.alias(normalized_type_name, "/long unsigned");
    r.alias(normalized_type_name, "/unsigned long");

    normalized_type_name = "/int" + boost::lexical_cast<std::string>(std::numeric_limits<long long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/signed long long int");
    r.alias(normalized_type_name, "/signed long int long");
    r.alias(normalized_type_name, "/signed int long long");
    r.alias(normalized_type_name, "/int signed long long");
    r.alias(normalized_type_name, "/long signed long int");
    r.alias(normalized_type_name, "/long long signed int");
    r.alias(normalized_type_name, "/long long int signed");
    r.alias(normalized_type_name, "/signed long long");
    r.alias(normalized_type_name, "/long long signed");
    r.alias(normalized_type_name, "/long signed long");
    r.alias(normalized_type_name, "/long long int");
    r.alias(normalized_type_name, "/long int long");
    r.alias(normalized_type_name, "/int long long");
    r.alias(normalized_type_name, "/long long");
    normalized_type_name = "/uint" + boost::lexical_cast<std::string>(std::numeric_limits<long long>::digits + 1) + "_t";
    r.alias(normalized_type_name, "/unsigned long long int");
    r.alias(normalized_type_name, "/unsigned long int long");
    r.alias(normalized_type_name, "/unsigned int long long");
    r.alias(normalized_type_name, "/int unsigned long long");
    r.alias(normalized_type_name, "/long unsigned long int");
    r.alias(normalized_type_name, "/long long unsigned int");
    r.alias(normalized_type_name, "/long long int unsigned");
    r.alias(normalized_type_name, "/unsigned long long");
    r.alias(normalized_type_name, "/long long unsigned");
    r.alias(normalized_type_name, "/long unsigned long");

    BOOST_STATIC_ASSERT(( sizeof(float) == sizeof(int32_t) ));
    BOOST_STATIC_ASSERT(( sizeof(double) == sizeof(int64_t) ));
    r.add(new Numeric("/float",  4, Numeric::Float));
    r.add(new Numeric("/double", 8, Numeric::Float));

    // Finally, add definition for boolean types
    r.add(new Numeric("/bool", sizeof(bool), Numeric::UInt));
}